

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall
CGraphics_Threaded::SetColor(CGraphics_Threaded *this,float r,float g,float b,float a)

{
  long in_FS_OFFSET;
  CColorVertex Array [4];
  undefined4 local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  undefined4 local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  undefined4 local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x222,(uint)(this->m_Drawing != 0),"called Graphics()->SetColor without begin");
  local_68 = 0;
  local_54 = 1;
  local_40 = 2;
  local_2c = 3;
  local_64 = r;
  local_60 = g;
  local_5c = b;
  local_58 = a;
  local_50 = r;
  local_4c = g;
  local_48 = b;
  local_44 = a;
  local_3c = r;
  local_38 = g;
  local_34 = b;
  local_30 = a;
  local_28 = r;
  local_24 = g;
  local_20 = b;
  local_1c = a;
  (**(code **)(*(long *)this + 0x100))(this,&local_68,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::SetColor(float r, float g, float b, float a)
{
	dbg_assert(m_Drawing != 0, "called Graphics()->SetColor without begin");
	CColorVertex Array[4] = {
		CColorVertex(0, r, g, b, a),
		CColorVertex(1, r, g, b, a),
		CColorVertex(2, r, g, b, a),
		CColorVertex(3, r, g, b, a)};
	SetColorVertex(Array, 4);
}